

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TgPermPhase(Abc_TgMan_t *pMan,int iVar)

{
  byte bVar1;
  word *pwVar2;
  word wVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  word *pwVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  word *pwVar14;
  ulong uVar15;
  
  uVar4 = 1 << ((char)pMan->nVars - 6U & 0x1f);
  if (pMan->nVars < 7) {
    uVar4 = 1;
  }
  uVar12 = (ulong)uVar4;
  bVar1 = pMan->pPermTRev[iVar];
  iVar11 = (int)(char)bVar1;
  pwVar2 = pMan->pTruth;
  if (0 < (int)uVar4) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)Abc_TgPermPhase::pCopy + lVar7) = *(undefined8 *)((long)pwVar2 + lVar7);
      lVar7 = lVar7 + 8;
    } while (uVar12 * 8 - lVar7 != 0);
    if (uVar4 == 1) {
      bVar6 = (byte)(1 << (bVar1 & 0x1f));
      Abc_TgPermPhase::pCopy[0] =
           (s_Truths6[iVar11] & Abc_TgPermPhase::pCopy[0]) >> (bVar6 & 0x3f) |
           Abc_TgPermPhase::pCopy[0] << (bVar6 & 0x3f) & s_Truths6[iVar11];
      uVar12 = 1;
    }
    else if ((char)bVar1 < '\x06') {
      uVar8 = s_Truths6[iVar11];
      lVar7 = 0;
      do {
        bVar6 = (byte)(1 << (bVar1 & 0x1f));
        *(ulong *)((long)Abc_TgPermPhase::pCopy + lVar7) =
             (*(ulong *)((long)Abc_TgPermPhase::pCopy + lVar7) & uVar8) >> (bVar6 & 0x3f) |
             *(ulong *)((long)Abc_TgPermPhase::pCopy + lVar7) << (bVar6 & 0x3f) & uVar8;
        lVar7 = lVar7 + 8;
      } while (uVar12 * 8 - lVar7 != 0);
    }
    else {
      bVar6 = (byte)(iVar11 + -6);
      uVar13 = 1 << (bVar6 & 0x1f);
      iVar9 = 2 << (bVar6 & 0x1f);
      uVar8 = 1;
      if (1 < (int)uVar13) {
        uVar8 = (ulong)uVar13;
      }
      pwVar10 = Abc_TgPermPhase::pCopy + (int)uVar13;
      pwVar14 = Abc_TgPermPhase::pCopy;
      do {
        if (iVar11 + -6 != 0x1f) {
          uVar15 = 0;
          do {
            wVar3 = pwVar14[uVar15];
            pwVar14[uVar15] = pwVar10[uVar15];
            pwVar10[uVar15] = wVar3;
            uVar15 = uVar15 + 1;
          } while (uVar8 != uVar15);
        }
        pwVar14 = pwVar14 + iVar9;
        pwVar10 = pwVar10 + iVar9;
      } while (pwVar14 < Abc_TgPermPhase::pCopy + uVar12);
    }
  }
  iVar11 = 0;
  uVar8 = uVar12;
  do {
    if ((int)uVar8 < 1) {
      return 0;
    }
    lVar7 = uVar8 + 0x3ff;
    lVar5 = uVar8 - 1;
    uVar8 = uVar8 - 1;
  } while (pwVar2[lVar5] == Abc_TgSymGroupPerm::pBest[lVar7]);
  if (Abc_TgSymGroupPerm::pBest[lVar7] <= pwVar2[lVar5]) {
    if (0 < (int)uVar4) {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)pwVar2 + lVar7) =
             *(undefined8 *)((long)Abc_TgPermPhase::pCopy + lVar7);
        lVar7 = lVar7 + 8;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    pMan->uPhase = pMan->uPhase ^ 1 << (bVar1 & 0x1f);
    iVar11 = 0x10;
  }
  return iVar11;
}

Assistant:

static int Abc_TgPermPhase(Abc_TgMan_t* pMan, int iVar)
{
    static word pCopy[1024];
    int nWords = Abc_TtWordNum(pMan->nVars);
    int ivp = pMan->pPermTRev[iVar];
    Abc_TtCopy(pCopy, pMan->pTruth, nWords, 0);
    Abc_TtFlip(pCopy, nWords, ivp);
    if (Abc_TtCompareRev(pMan->pTruth, pCopy, nWords) == 1)
    {
        Abc_TtCopy(pMan->pTruth, pCopy, nWords, 0);
        pMan->uPhase ^= 1 << ivp;
        return 16;
    }
    return 0;
}